

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

bool __thiscall FIX::DataDictionary::shouldCheckTag(DataDictionary *this,FieldBase *field)

{
  int iVar1;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  if (((this->m_allowUnknownMessageFields & 1U) != 0) &&
     (iVar1 = FieldBase::getTag(field), iVar1 < 5000)) {
    return false;
  }
  if (((this->m_checkUserDefinedFields & 1U) == 0) &&
     (iVar1 = FieldBase::getTag(field), 4999 < iVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool shouldCheckTag(const FieldBase &field) const {
    if (m_allowUnknownMessageFields && field.getTag() < FIELD::UserMin) {
      return false;
    } else if (!m_checkUserDefinedFields && field.getTag() >= FIELD::UserMin) {
      return false;
    } else {
      return true;
    }
  }